

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Summary.cpp
# Opt level: O1

void xmrig::Summary::print(Controller *controller)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Config *pCVar4;
  ICpuInfo *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar6;
  
  pCVar4 = Base::config(&controller->super_Base);
  BaseConfig::printVersions(&pCVar4->super_BaseConfig);
  Base::config(&controller->super_Base);
  Base::config(&controller->super_Base);
  pIVar5 = Cpu::info();
  iVar1 = (*pIVar5->_vptr_ICpuInfo[6])(pIVar5);
  iVar2 = (*pIVar5->_vptr_ICpuInfo[0xc])(pIVar5);
  iVar3 = (*pIVar5->_vptr_ICpuInfo[3])(pIVar5);
  pcVar6 = "\x1b[1;31m-";
  if ((char)iVar3 != '\0') {
    pcVar6 = "\x1b[1;32m";
  }
  Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s%s (%zu)\x1b[0m %sx64 %sAES","CPU",
             CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2),"\x1b[1;32m",pcVar6);
  (*pIVar5->_vptr_ICpuInfo[9])(pIVar5);
  (*pIVar5->_vptr_ICpuInfo[10])(pIVar5);
  iVar1 = (*pIVar5->_vptr_ICpuInfo[8])(pIVar5);
  iVar2 = (*pIVar5->_vptr_ICpuInfo[0xd])(pIVar5);
  iVar3 = (*pIVar5->_vptr_ICpuInfo[0xb])(pIVar5);
  Log::print("\x1b[1;37m   %-13s\x1b[0m\x1b[1;30mL2:\x1b[0m\x1b[1;37m%.1f MB\x1b[0m\x1b[1;30m L3:\x1b[0m\x1b[1;37m%.1f MB\x1b[0m\x1b[1;36m %zu\x1b[0mC\x1b[1;30m/\x1b[0m\x1b[1;36m%zu\x1b[0mT\x1b[1;30m NUMA:\x1b[0m\x1b[1;36m%zu\x1b[0m"
             ,"",CONCAT44(extraout_var_01,iVar1),CONCAT44(extraout_var_02,iVar2),
             CONCAT44(extraout_var_03,iVar3));
  pCVar4 = Base::config(&controller->super_Base);
  Pools::print(&(pCVar4->super_BaseConfig).m_pools);
  Base::config(&controller->super_Base);
  pcVar6 = " * COMMANDS     \'h\' hashrate, \'p\' pause, \'r\' resume";
  if (Log::colors != '\0') {
    pcVar6 = 
    "\x1b[1;32m * \x1b[0m\x1b[1;37mCOMMANDS     \x1b[0m\x1b[45m\x1b[1;37mh\x1b[0m\x1b[1;37mashrate, \x1b[0m\x1b[45m\x1b[1;37mp\x1b[0m\x1b[1;37mause, \x1b[0m\x1b[45m\x1b[1;37mr\x1b[0m\x1b[1;37mesume\x1b[0m"
    ;
  }
  Log::print(pcVar6);
  return;
}

Assistant:

void xmrig::Summary::print(Controller *controller)
{
    controller->config()->printVersions();
    print_memory(controller->config());
    print_cpu(controller->config());
    controller->config()->pools().print();
    print_commands(controller->config());
}